

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 (*pauVar40) [16];
  int iVar41;
  uint uVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  undefined4 uVar51;
  ulong unaff_R12;
  ulong uVar52;
  ulong uVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar59 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar93;
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar104 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar120;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar125 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1530 [16];
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [16];
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar50 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar51 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1450._4_4_ = uVar51;
  local_1450._0_4_ = uVar51;
  local_1450._8_4_ = uVar51;
  local_1450._12_4_ = uVar51;
  auVar100 = ZEXT1664(local_1450);
  uVar51 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = uVar51;
  local_1460._0_4_ = uVar51;
  local_1460._8_4_ = uVar51;
  local_1460._12_4_ = uVar51;
  auVar104 = ZEXT1664(local_1460);
  uVar51 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1470._4_4_ = uVar51;
  local_1470._0_4_ = uVar51;
  local_1470._8_4_ = uVar51;
  local_1470._12_4_ = uVar51;
  auVar113 = ZEXT1664(local_1470);
  local_14b0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_14c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14d0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1480 = local_14b0 * 0.99999964;
  local_1490 = local_14c0 * 0.99999964;
  local_14a0 = local_14d0 * 0.99999964;
  local_14b0 = local_14b0 * 1.0000004;
  local_14c0 = local_14c0 * 1.0000004;
  local_14d0 = local_14d0 * 1.0000004;
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar41 = (tray->tnear).field_0.i[k];
  local_1530._4_4_ = iVar41;
  local_1530._0_4_ = iVar41;
  local_1530._8_4_ = iVar41;
  local_1530._12_4_ = iVar41;
  auVar99 = ZEXT1664(local_1530);
  iVar41 = (tray->tfar).field_0.i[k];
  auVar57 = ZEXT1664(CONCAT412(iVar41,CONCAT48(iVar41,CONCAT44(iVar41,iVar41))));
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  iVar41 = 1 << ((uint)k & 0x1f);
  auVar60._4_4_ = iVar41;
  auVar60._0_4_ = iVar41;
  auVar60._8_4_ = iVar41;
  auVar60._12_4_ = iVar41;
  auVar60._16_4_ = iVar41;
  auVar60._20_4_ = iVar41;
  auVar60._24_4_ = iVar41;
  auVar60._28_4_ = iVar41;
  auVar61 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar60 = vpand_avx2(auVar60,auVar61);
  local_1260 = vpcmpeqd_avx2(auVar60,auVar61);
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = &DAT_3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  auVar61._8_4_ = 0xbf800000;
  auVar61._0_8_ = 0xbf800000bf800000;
  auVar61._12_4_ = 0xbf800000;
  auVar61._16_4_ = 0xbf800000;
  auVar61._20_4_ = 0xbf800000;
  auVar61._24_4_ = 0xbf800000;
  auVar61._28_4_ = 0xbf800000;
  _local_1240 = vblendvps_avx(auVar66,auVar61,local_1220);
  fVar114 = local_1480;
  fVar117 = local_1480;
  fVar118 = local_1480;
  fVar119 = local_1480;
  fVar120 = local_1490;
  fVar123 = local_1490;
  fVar124 = local_1490;
  fVar88 = local_1490;
  fVar101 = local_14a0;
  fVar93 = local_14a0;
  fVar94 = local_14a0;
  fVar95 = local_14a0;
  fVar96 = local_14b0;
  fVar97 = local_14b0;
  fVar126 = local_14b0;
  fVar127 = local_14b0;
  fVar128 = local_14c0;
  fVar130 = local_14c0;
  fVar131 = local_14c0;
  fVar132 = local_14c0;
  fVar133 = local_14d0;
  fVar135 = local_14d0;
  fVar136 = local_14d0;
  fVar137 = local_14d0;
  fStack_14cc = local_14d0;
  fStack_14c8 = local_14d0;
  fStack_14c4 = local_14d0;
  fStack_14bc = local_14c0;
  fStack_14b8 = local_14c0;
  fStack_14b4 = local_14c0;
  fStack_14ac = local_14b0;
  fStack_14a8 = local_14b0;
  fStack_14a4 = local_14b0;
  fStack_149c = local_14a0;
  fStack_1498 = local_14a0;
  fStack_1494 = local_14a0;
  fStack_148c = local_1490;
  fStack_1488 = local_1490;
  fStack_1484 = local_1490;
  fStack_147c = local_1480;
  fStack_1478 = local_1480;
  fStack_1474 = local_1480;
  do {
    do {
      do {
        if (pauVar50 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar40 = pauVar50 + -1;
        pauVar50 = pauVar50 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar40 + 8));
      uVar53 = *(ulong *)*pauVar50;
      do {
        if ((uVar53 & 8) == 0) {
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar48),auVar100._0_16_);
          auVar58._0_4_ = fVar114 * auVar59._0_4_;
          auVar58._4_4_ = fVar117 * auVar59._4_4_;
          auVar58._8_4_ = fVar118 * auVar59._8_4_;
          auVar58._12_4_ = fVar119 * auVar59._12_4_;
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar49),auVar104._0_16_);
          auVar69._0_4_ = fVar120 * auVar59._0_4_;
          auVar69._4_4_ = fVar123 * auVar59._4_4_;
          auVar69._8_4_ = fVar124 * auVar59._8_4_;
          auVar69._12_4_ = fVar88 * auVar59._12_4_;
          auVar59 = vmaxps_avx(auVar58,auVar69);
          auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar46),auVar113._0_16_);
          auVar70._0_4_ = fVar101 * auVar58._0_4_;
          auVar70._4_4_ = fVar93 * auVar58._4_4_;
          auVar70._8_4_ = fVar94 * auVar58._8_4_;
          auVar70._12_4_ = fVar95 * auVar58._12_4_;
          auVar58 = vmaxps_avx(auVar70,auVar99._0_16_);
          local_1420 = vmaxps_avx(auVar59,auVar58);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar48 ^ 0x10)),
                               auVar100._0_16_);
          auVar71._0_4_ = fVar96 * auVar59._0_4_;
          auVar71._4_4_ = fVar97 * auVar59._4_4_;
          auVar71._8_4_ = fVar126 * auVar59._8_4_;
          auVar71._12_4_ = fVar127 * auVar59._12_4_;
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar49 ^ 0x10)),
                               auVar104._0_16_);
          auVar76._0_4_ = fVar128 * auVar59._0_4_;
          auVar76._4_4_ = fVar130 * auVar59._4_4_;
          auVar76._8_4_ = fVar131 * auVar59._8_4_;
          auVar76._12_4_ = fVar132 * auVar59._12_4_;
          auVar59 = vminps_avx(auVar71,auVar76);
          auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar46 ^ 0x10)),
                               auVar113._0_16_);
          auVar77._0_4_ = fVar133 * auVar58._0_4_;
          auVar77._4_4_ = fVar135 * auVar58._4_4_;
          auVar77._8_4_ = fVar136 * auVar58._8_4_;
          auVar77._12_4_ = fVar137 * auVar58._12_4_;
          auVar58 = vminps_avx(auVar77,auVar57._0_16_);
          auVar59 = vminps_avx(auVar59,auVar58);
          auVar59 = vcmpps_avx(local_1420,auVar59,2);
          uVar51 = vmovmskps_avx(auVar59);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar51);
        }
        if ((uVar53 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar41 = 4;
          }
          else {
            uVar52 = uVar53 & 0xfffffffffffffff0;
            lVar45 = 0;
            for (uVar53 = unaff_R12; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
              lVar45 = lVar45 + 1;
            }
            iVar41 = 0;
            uVar47 = unaff_R12 - 1 & unaff_R12;
            uVar53 = *(ulong *)(uVar52 + lVar45 * 8);
            if (uVar47 != 0) {
              uVar43 = *(uint *)(local_1420 + lVar45 * 4);
              lVar45 = 0;
              for (uVar19 = uVar47; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar45 = lVar45 + 1;
              }
              uVar47 = uVar47 - 1 & uVar47;
              uVar19 = *(ulong *)(uVar52 + lVar45 * 8);
              uVar42 = *(uint *)(local_1420 + lVar45 * 4);
              if (uVar47 == 0) {
                if (uVar43 < uVar42) {
                  *(ulong *)*pauVar50 = uVar19;
                  *(uint *)(*pauVar50 + 8) = uVar42;
                  pauVar50 = pauVar50 + 1;
                }
                else {
                  *(ulong *)*pauVar50 = uVar53;
                  *(uint *)(*pauVar50 + 8) = uVar43;
                  pauVar50 = pauVar50 + 1;
                  uVar53 = uVar19;
                }
              }
              else {
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar53;
                auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar43));
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar19;
                auVar58 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar42));
                lVar45 = 0;
                for (uVar53 = uVar47; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000)
                {
                  lVar45 = lVar45 + 1;
                }
                uVar47 = uVar47 - 1 & uVar47;
                auVar78._8_8_ = 0;
                auVar78._0_8_ = *(ulong *)(uVar52 + lVar45 * 8);
                auVar70 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_1420 + lVar45 * 4)));
                auVar69 = vpcmpgtd_avx(auVar58,auVar59);
                if (uVar47 == 0) {
                  auVar71 = vpshufd_avx(auVar69,0xaa);
                  auVar69 = vblendvps_avx(auVar58,auVar59,auVar71);
                  auVar59 = vblendvps_avx(auVar59,auVar58,auVar71);
                  auVar58 = vpcmpgtd_avx(auVar70,auVar69);
                  auVar71 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar70,auVar69,auVar71);
                  auVar69 = vblendvps_avx(auVar69,auVar70,auVar71);
                  auVar70 = vpcmpgtd_avx(auVar69,auVar59);
                  auVar71 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar69,auVar59,auVar71);
                  auVar59 = vblendvps_avx(auVar59,auVar69,auVar71);
                  *pauVar50 = auVar59;
                  pauVar50[1] = auVar70;
                  uVar53 = auVar58._0_8_;
                  pauVar50 = pauVar50 + 2;
                }
                else {
                  lVar45 = 0;
                  for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                    lVar45 = lVar45 + 1;
                  }
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = *(ulong *)(uVar52 + lVar45 * 8);
                  auVar76 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1420 + lVar45 * 4)));
                  auVar71 = vpshufd_avx(auVar69,0xaa);
                  auVar69 = vblendvps_avx(auVar58,auVar59,auVar71);
                  auVar59 = vblendvps_avx(auVar59,auVar58,auVar71);
                  auVar58 = vpcmpgtd_avx(auVar76,auVar70);
                  auVar71 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar76,auVar70,auVar71);
                  auVar70 = vblendvps_avx(auVar70,auVar76,auVar71);
                  auVar71 = vpcmpgtd_avx(auVar70,auVar59);
                  auVar76 = vpshufd_avx(auVar71,0xaa);
                  auVar71 = vblendvps_avx(auVar70,auVar59,auVar76);
                  auVar59 = vblendvps_avx(auVar59,auVar70,auVar76);
                  auVar70 = vpcmpgtd_avx(auVar58,auVar69);
                  auVar76 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar58,auVar69,auVar76);
                  auVar58 = vblendvps_avx(auVar69,auVar58,auVar76);
                  auVar69 = vpcmpgtd_avx(auVar71,auVar58);
                  auVar76 = vpshufd_avx(auVar69,0xaa);
                  auVar69 = vblendvps_avx(auVar71,auVar58,auVar76);
                  auVar58 = vblendvps_avx(auVar58,auVar71,auVar76);
                  *pauVar50 = auVar59;
                  pauVar50[1] = auVar58;
                  pauVar50[2] = auVar69;
                  auVar99 = ZEXT1664(local_1530);
                  uVar53 = auVar70._0_8_;
                  pauVar50 = pauVar50 + 3;
                }
              }
            }
          }
        }
        else {
          iVar41 = 6;
        }
      } while (iVar41 == 0);
    } while (iVar41 != 6);
    uVar52 = (ulong)((uint)uVar53 & 0xf);
    if (uVar52 != 8) {
      uVar53 = uVar53 & 0xfffffffffffffff0;
      lVar45 = 0;
      do {
        lVar44 = lVar45 * 0x60;
        pSVar3 = context->scene;
        ppfVar4 = (pSVar3->vertices).items;
        pfVar5 = ppfVar4[*(uint *)(uVar53 + 0x40 + lVar44)];
        auVar73._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + 0x20 + lVar44));
        auVar73._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + lVar44));
        pfVar6 = ppfVar4[*(uint *)(uVar53 + 0x48 + lVar44)];
        auVar79._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 0x28 + lVar44));
        auVar79._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 8 + lVar44));
        pfVar7 = ppfVar4[*(uint *)(uVar53 + 0x44 + lVar44)];
        auVar90._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 0x24 + lVar44));
        auVar90._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 4 + lVar44));
        pfVar8 = ppfVar4[*(uint *)(uVar53 + 0x4c + lVar44)];
        auVar111._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0x2c + lVar44));
        auVar111._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0xc + lVar44));
        lVar1 = uVar53 + 0x40 + lVar44;
        local_10e0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar1 = uVar53 + 0x50 + lVar44;
        local_1440 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1438 = *(undefined8 *)(lVar1 + 0x18);
        auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + 0x10 + lVar44)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 0x18 + lVar44)));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + 0x10 + lVar44)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 0x18 + lVar44)));
        auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 0x14 + lVar44)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0x1c + lVar44)));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 0x14 + lVar44)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0x1c + lVar44)));
        auVar71 = vunpcklps_avx(auVar59,auVar58);
        auVar76 = vunpcklps_avx(auVar69,auVar70);
        auVar59 = vunpckhps_avx(auVar69,auVar70);
        auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + 0x30 + lVar44)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 0x38 + lVar44)));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar53 + 0x30 + lVar44)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar53 + 0x38 + lVar44)));
        auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 0x34 + lVar44)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0x3c + lVar44)));
        auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar53 + 0x34 + lVar44)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar53 + 0x3c + lVar44)));
        auVar69 = vunpcklps_avx(auVar58,auVar69);
        auVar72 = vunpcklps_avx(auVar70,auVar77);
        auVar58 = vunpckhps_avx(auVar70,auVar77);
        uStack_1430 = local_1440;
        uStack_1428 = uStack_1438;
        auVar60 = vunpcklps_avx(auVar90,auVar111);
        auVar61 = vunpcklps_avx(auVar73,auVar79);
        auVar86 = vunpcklps_avx(auVar61,auVar60);
        auVar60 = vunpckhps_avx(auVar61,auVar60);
        auVar61 = vunpckhps_avx(auVar90,auVar111);
        auVar66 = vunpckhps_avx(auVar73,auVar79);
        auVar61 = vunpcklps_avx(auVar66,auVar61);
        auVar80._16_16_ = auVar76;
        auVar80._0_16_ = auVar76;
        auVar91._16_16_ = auVar59;
        auVar91._0_16_ = auVar59;
        auVar62._16_16_ = auVar71;
        auVar62._0_16_ = auVar71;
        auVar134._16_16_ = auVar72;
        auVar134._0_16_ = auVar72;
        auVar83._16_16_ = auVar58;
        auVar83._0_16_ = auVar58;
        uVar51 = *(undefined4 *)(ray + k * 4);
        auVar102._4_4_ = uVar51;
        auVar102._0_4_ = uVar51;
        auVar102._8_4_ = uVar51;
        auVar102._12_4_ = uVar51;
        auVar102._16_4_ = uVar51;
        auVar102._20_4_ = uVar51;
        auVar102._24_4_ = uVar51;
        auVar102._28_4_ = uVar51;
        uVar51 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar121._4_4_ = uVar51;
        auVar121._0_4_ = uVar51;
        auVar121._8_4_ = uVar51;
        auVar121._12_4_ = uVar51;
        auVar121._16_4_ = uVar51;
        auVar121._20_4_ = uVar51;
        auVar121._24_4_ = uVar51;
        auVar121._28_4_ = uVar51;
        auVar54._16_16_ = auVar69;
        auVar54._0_16_ = auVar69;
        uVar51 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar125._4_4_ = uVar51;
        auVar125._0_4_ = uVar51;
        auVar125._8_4_ = uVar51;
        auVar125._12_4_ = uVar51;
        auVar125._16_4_ = uVar51;
        auVar125._20_4_ = uVar51;
        auVar125._24_4_ = uVar51;
        auVar125._28_4_ = uVar51;
        auVar86 = vsubps_avx(auVar86,auVar102);
        local_15a0 = vsubps_avx(auVar60,auVar121);
        local_1520 = vsubps_avx(auVar61,auVar125);
        auVar60 = vsubps_avx(auVar80,auVar102);
        auVar61 = vsubps_avx(auVar91,auVar121);
        auVar66 = vsubps_avx(auVar62,auVar125);
        auVar62 = vsubps_avx(auVar134,auVar102);
        auVar73 = vsubps_avx(auVar83,auVar121);
        auVar16 = vsubps_avx(auVar54,auVar125);
        local_1100 = vsubps_avx(auVar62,auVar86);
        local_1140 = vsubps_avx(auVar73,local_15a0);
        local_1120 = vsubps_avx(auVar16,local_1520);
        auVar55._0_4_ = auVar86._0_4_ + auVar62._0_4_;
        auVar55._4_4_ = auVar86._4_4_ + auVar62._4_4_;
        auVar55._8_4_ = auVar86._8_4_ + auVar62._8_4_;
        auVar55._12_4_ = auVar86._12_4_ + auVar62._12_4_;
        auVar55._16_4_ = auVar86._16_4_ + auVar62._16_4_;
        auVar55._20_4_ = auVar86._20_4_ + auVar62._20_4_;
        auVar55._24_4_ = auVar86._24_4_ + auVar62._24_4_;
        auVar55._28_4_ = auVar86._28_4_ + auVar62._28_4_;
        auVar74._0_4_ = local_15a0._0_4_ + auVar73._0_4_;
        auVar74._4_4_ = local_15a0._4_4_ + auVar73._4_4_;
        auVar74._8_4_ = local_15a0._8_4_ + auVar73._8_4_;
        auVar74._12_4_ = local_15a0._12_4_ + auVar73._12_4_;
        auVar74._16_4_ = local_15a0._16_4_ + auVar73._16_4_;
        auVar74._20_4_ = local_15a0._20_4_ + auVar73._20_4_;
        auVar74._24_4_ = local_15a0._24_4_ + auVar73._24_4_;
        auVar74._28_4_ = local_15a0._28_4_ + auVar73._28_4_;
        fVar114 = local_1520._0_4_;
        auVar84._0_4_ = auVar16._0_4_ + fVar114;
        fVar117 = local_1520._4_4_;
        auVar84._4_4_ = auVar16._4_4_ + fVar117;
        fVar118 = local_1520._8_4_;
        auVar84._8_4_ = auVar16._8_4_ + fVar118;
        fVar119 = local_1520._12_4_;
        auVar84._12_4_ = auVar16._12_4_ + fVar119;
        fVar120 = local_1520._16_4_;
        auVar84._16_4_ = auVar16._16_4_ + fVar120;
        fVar123 = local_1520._20_4_;
        auVar84._20_4_ = auVar16._20_4_ + fVar123;
        fVar124 = local_1520._24_4_;
        auVar84._24_4_ = auVar16._24_4_ + fVar124;
        fVar88 = local_1520._28_4_;
        auVar84._28_4_ = auVar16._28_4_ + fVar88;
        auVar17._4_4_ = local_1120._4_4_ * auVar74._4_4_;
        auVar17._0_4_ = local_1120._0_4_ * auVar74._0_4_;
        auVar17._8_4_ = local_1120._8_4_ * auVar74._8_4_;
        auVar17._12_4_ = local_1120._12_4_ * auVar74._12_4_;
        auVar17._16_4_ = local_1120._16_4_ * auVar74._16_4_;
        auVar17._20_4_ = local_1120._20_4_ * auVar74._20_4_;
        auVar17._24_4_ = local_1120._24_4_ * auVar74._24_4_;
        auVar17._28_4_ = uVar51;
        auVar58 = vfmsub231ps_fma(auVar17,local_1140,auVar84);
        auVar18._4_4_ = local_1100._4_4_ * auVar84._4_4_;
        auVar18._0_4_ = local_1100._0_4_ * auVar84._0_4_;
        auVar18._8_4_ = local_1100._8_4_ * auVar84._8_4_;
        auVar18._12_4_ = local_1100._12_4_ * auVar84._12_4_;
        auVar18._16_4_ = local_1100._16_4_ * auVar84._16_4_;
        auVar18._20_4_ = local_1100._20_4_ * auVar84._20_4_;
        auVar18._24_4_ = local_1100._24_4_ * auVar84._24_4_;
        auVar18._28_4_ = auVar84._28_4_;
        auVar59 = vfmsub231ps_fma(auVar18,local_1120,auVar55);
        auVar20._4_4_ = local_1140._4_4_ * auVar55._4_4_;
        auVar20._0_4_ = local_1140._0_4_ * auVar55._0_4_;
        auVar20._8_4_ = local_1140._8_4_ * auVar55._8_4_;
        auVar20._12_4_ = local_1140._12_4_ * auVar55._12_4_;
        auVar20._16_4_ = local_1140._16_4_ * auVar55._16_4_;
        auVar20._20_4_ = local_1140._20_4_ * auVar55._20_4_;
        auVar20._24_4_ = local_1140._24_4_ * auVar55._24_4_;
        auVar20._28_4_ = auVar55._28_4_;
        auVar69 = vfmsub231ps_fma(auVar20,local_1100,auVar74);
        uVar51 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar122._4_4_ = uVar51;
        auVar122._0_4_ = uVar51;
        auVar122._8_4_ = uVar51;
        auVar122._12_4_ = uVar51;
        auVar122._16_4_ = uVar51;
        auVar122._20_4_ = uVar51;
        auVar122._24_4_ = uVar51;
        auVar122._28_4_ = uVar51;
        local_1180 = *(float *)(ray + k * 4 + 0xc0);
        auVar21._4_4_ = local_1180 * auVar69._4_4_;
        auVar21._0_4_ = local_1180 * auVar69._0_4_;
        auVar21._8_4_ = local_1180 * auVar69._8_4_;
        auVar21._12_4_ = local_1180 * auVar69._12_4_;
        auVar21._16_4_ = local_1180 * 0.0;
        auVar21._20_4_ = local_1180 * 0.0;
        auVar21._24_4_ = local_1180 * 0.0;
        auVar21._28_4_ = auVar74._28_4_;
        auVar59 = vfmadd231ps_fma(auVar21,auVar122,ZEXT1632(auVar59));
        uVar51 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1160._4_4_ = uVar51;
        local_1160._0_4_ = uVar51;
        local_1160._8_4_ = uVar51;
        local_1160._12_4_ = uVar51;
        local_1160._16_4_ = uVar51;
        local_1160._20_4_ = uVar51;
        local_1160._24_4_ = uVar51;
        local_1160._28_4_ = uVar51;
        local_1420 = vfmadd231ps_fma(ZEXT1632(auVar59),local_1160,ZEXT1632(auVar58));
        local_11a0 = vsubps_avx(local_15a0,auVar61);
        local_11c0 = vsubps_avx(local_1520,auVar66);
        auVar129._0_4_ = local_15a0._0_4_ + auVar61._0_4_;
        auVar129._4_4_ = local_15a0._4_4_ + auVar61._4_4_;
        auVar129._8_4_ = local_15a0._8_4_ + auVar61._8_4_;
        auVar129._12_4_ = local_15a0._12_4_ + auVar61._12_4_;
        auVar129._16_4_ = local_15a0._16_4_ + auVar61._16_4_;
        auVar129._20_4_ = local_15a0._20_4_ + auVar61._20_4_;
        auVar129._24_4_ = local_15a0._24_4_ + auVar61._24_4_;
        auVar129._28_4_ = local_15a0._28_4_ + auVar61._28_4_;
        auVar85._0_4_ = fVar114 + auVar66._0_4_;
        auVar85._4_4_ = fVar117 + auVar66._4_4_;
        auVar85._8_4_ = fVar118 + auVar66._8_4_;
        auVar85._12_4_ = fVar119 + auVar66._12_4_;
        auVar85._16_4_ = fVar120 + auVar66._16_4_;
        auVar85._20_4_ = fVar123 + auVar66._20_4_;
        auVar85._24_4_ = fVar124 + auVar66._24_4_;
        fVar101 = auVar66._28_4_;
        auVar85._28_4_ = fVar88 + fVar101;
        fVar93 = local_11c0._0_4_;
        fVar95 = local_11c0._4_4_;
        auVar22._4_4_ = auVar129._4_4_ * fVar95;
        auVar22._0_4_ = auVar129._0_4_ * fVar93;
        fVar126 = local_11c0._8_4_;
        auVar22._8_4_ = auVar129._8_4_ * fVar126;
        fVar130 = local_11c0._12_4_;
        auVar22._12_4_ = auVar129._12_4_ * fVar130;
        fVar133 = local_11c0._16_4_;
        auVar22._16_4_ = auVar129._16_4_ * fVar133;
        fVar137 = local_11c0._20_4_;
        auVar22._20_4_ = auVar129._20_4_ * fVar137;
        fVar13 = local_11c0._24_4_;
        auVar22._24_4_ = auVar129._24_4_ * fVar13;
        auVar22._28_4_ = fVar88;
        auVar58 = vfmsub231ps_fma(auVar22,local_11a0,auVar85);
        auVar17 = vsubps_avx(auVar86,auVar60);
        fVar88 = auVar17._0_4_;
        fVar96 = auVar17._4_4_;
        auVar23._4_4_ = auVar85._4_4_ * fVar96;
        auVar23._0_4_ = auVar85._0_4_ * fVar88;
        fVar127 = auVar17._8_4_;
        auVar23._8_4_ = auVar85._8_4_ * fVar127;
        fVar131 = auVar17._12_4_;
        auVar23._12_4_ = auVar85._12_4_ * fVar131;
        fVar135 = auVar17._16_4_;
        auVar23._16_4_ = auVar85._16_4_ * fVar135;
        fVar11 = auVar17._20_4_;
        auVar23._20_4_ = auVar85._20_4_ * fVar11;
        fVar14 = auVar17._24_4_;
        auVar23._24_4_ = auVar85._24_4_ * fVar14;
        auVar23._28_4_ = auVar85._28_4_;
        auVar115._0_4_ = auVar86._0_4_ + auVar60._0_4_;
        auVar115._4_4_ = auVar86._4_4_ + auVar60._4_4_;
        auVar115._8_4_ = auVar86._8_4_ + auVar60._8_4_;
        auVar115._12_4_ = auVar86._12_4_ + auVar60._12_4_;
        auVar115._16_4_ = auVar86._16_4_ + auVar60._16_4_;
        auVar115._20_4_ = auVar86._20_4_ + auVar60._20_4_;
        auVar115._24_4_ = auVar86._24_4_ + auVar60._24_4_;
        auVar115._28_4_ = auVar86._28_4_ + auVar60._28_4_;
        auVar59 = vfmsub231ps_fma(auVar23,local_11c0,auVar115);
        fVar94 = local_11a0._0_4_;
        fVar97 = local_11a0._4_4_;
        auVar24._4_4_ = auVar115._4_4_ * fVar97;
        auVar24._0_4_ = auVar115._0_4_ * fVar94;
        fVar128 = local_11a0._8_4_;
        auVar24._8_4_ = auVar115._8_4_ * fVar128;
        fVar132 = local_11a0._12_4_;
        auVar24._12_4_ = auVar115._12_4_ * fVar132;
        fVar136 = local_11a0._16_4_;
        auVar24._16_4_ = auVar115._16_4_ * fVar136;
        fVar12 = local_11a0._20_4_;
        auVar24._20_4_ = auVar115._20_4_ * fVar12;
        fVar15 = local_11a0._24_4_;
        auVar24._24_4_ = auVar115._24_4_ * fVar15;
        auVar24._28_4_ = local_11c0._28_4_;
        auVar69 = vfmsub231ps_fma(auVar24,auVar17,auVar129);
        auVar25._4_4_ = auVar69._4_4_ * local_1180;
        auVar25._0_4_ = auVar69._0_4_ * local_1180;
        auVar25._8_4_ = auVar69._8_4_ * local_1180;
        auVar25._12_4_ = auVar69._12_4_ * local_1180;
        auVar25._16_4_ = local_1180 * 0.0;
        auVar25._20_4_ = local_1180 * 0.0;
        auVar25._24_4_ = local_1180 * 0.0;
        auVar25._28_4_ = auVar129._28_4_;
        auVar59 = vfmadd231ps_fma(auVar25,auVar122,ZEXT1632(auVar59));
        auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),local_1160,ZEXT1632(auVar58));
        auVar18 = vsubps_avx(auVar60,auVar62);
        auVar81._0_4_ = auVar60._0_4_ + auVar62._0_4_;
        auVar81._4_4_ = auVar60._4_4_ + auVar62._4_4_;
        auVar81._8_4_ = auVar60._8_4_ + auVar62._8_4_;
        auVar81._12_4_ = auVar60._12_4_ + auVar62._12_4_;
        auVar81._16_4_ = auVar60._16_4_ + auVar62._16_4_;
        auVar81._20_4_ = auVar60._20_4_ + auVar62._20_4_;
        auVar81._24_4_ = auVar60._24_4_ + auVar62._24_4_;
        auVar81._28_4_ = auVar60._28_4_ + auVar62._28_4_;
        auVar62 = vsubps_avx(auVar61,auVar73);
        auVar92._0_4_ = auVar61._0_4_ + auVar73._0_4_;
        auVar92._4_4_ = auVar61._4_4_ + auVar73._4_4_;
        auVar92._8_4_ = auVar61._8_4_ + auVar73._8_4_;
        auVar92._12_4_ = auVar61._12_4_ + auVar73._12_4_;
        auVar92._16_4_ = auVar61._16_4_ + auVar73._16_4_;
        auVar92._20_4_ = auVar61._20_4_ + auVar73._20_4_;
        auVar92._24_4_ = auVar61._24_4_ + auVar73._24_4_;
        auVar92._28_4_ = auVar61._28_4_ + auVar73._28_4_;
        auVar73 = vsubps_avx(auVar66,auVar16);
        auVar63._0_4_ = auVar66._0_4_ + auVar16._0_4_;
        auVar63._4_4_ = auVar66._4_4_ + auVar16._4_4_;
        auVar63._8_4_ = auVar66._8_4_ + auVar16._8_4_;
        auVar63._12_4_ = auVar66._12_4_ + auVar16._12_4_;
        auVar63._16_4_ = auVar66._16_4_ + auVar16._16_4_;
        auVar63._20_4_ = auVar66._20_4_ + auVar16._20_4_;
        auVar63._24_4_ = auVar66._24_4_ + auVar16._24_4_;
        auVar63._28_4_ = fVar101 + auVar16._28_4_;
        auVar16._4_4_ = auVar73._4_4_ * auVar92._4_4_;
        auVar16._0_4_ = auVar73._0_4_ * auVar92._0_4_;
        auVar16._8_4_ = auVar73._8_4_ * auVar92._8_4_;
        auVar16._12_4_ = auVar73._12_4_ * auVar92._12_4_;
        auVar16._16_4_ = auVar73._16_4_ * auVar92._16_4_;
        auVar16._20_4_ = auVar73._20_4_ * auVar92._20_4_;
        auVar16._24_4_ = auVar73._24_4_ * auVar92._24_4_;
        auVar16._28_4_ = fVar101;
        auVar69 = vfmsub231ps_fma(auVar16,auVar62,auVar63);
        auVar26._4_4_ = auVar63._4_4_ * auVar18._4_4_;
        auVar26._0_4_ = auVar63._0_4_ * auVar18._0_4_;
        auVar26._8_4_ = auVar63._8_4_ * auVar18._8_4_;
        auVar26._12_4_ = auVar63._12_4_ * auVar18._12_4_;
        auVar26._16_4_ = auVar63._16_4_ * auVar18._16_4_;
        auVar26._20_4_ = auVar63._20_4_ * auVar18._20_4_;
        auVar26._24_4_ = auVar63._24_4_ * auVar18._24_4_;
        auVar26._28_4_ = auVar63._28_4_;
        auVar58 = vfmsub231ps_fma(auVar26,auVar73,auVar81);
        auVar27._4_4_ = auVar62._4_4_ * auVar81._4_4_;
        auVar27._0_4_ = auVar62._0_4_ * auVar81._0_4_;
        auVar27._8_4_ = auVar62._8_4_ * auVar81._8_4_;
        auVar27._12_4_ = auVar62._12_4_ * auVar81._12_4_;
        auVar27._16_4_ = auVar62._16_4_ * auVar81._16_4_;
        auVar27._20_4_ = auVar62._20_4_ * auVar81._20_4_;
        auVar27._24_4_ = auVar62._24_4_ * auVar81._24_4_;
        auVar27._28_4_ = auVar81._28_4_;
        auVar70 = vfmsub231ps_fma(auVar27,auVar18,auVar92);
        fStack_117c = local_1180;
        fStack_1178 = local_1180;
        fStack_1174 = local_1180;
        fStack_1170 = local_1180;
        fStack_116c = local_1180;
        fStack_1168 = local_1180;
        fStack_1164 = local_1180;
        auVar82._0_4_ = local_1180 * auVar70._0_4_;
        auVar82._4_4_ = local_1180 * auVar70._4_4_;
        auVar82._8_4_ = local_1180 * auVar70._8_4_;
        auVar82._12_4_ = local_1180 * auVar70._12_4_;
        auVar82._16_4_ = local_1180 * 0.0;
        auVar82._20_4_ = local_1180 * 0.0;
        auVar82._24_4_ = local_1180 * 0.0;
        auVar82._28_4_ = 0;
        auVar58 = vfmadd231ps_fma(auVar82,auVar122,ZEXT1632(auVar58));
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),local_1160,ZEXT1632(auVar69));
        local_13e0 = ZEXT1632(CONCAT412(auVar58._12_4_ + auVar59._12_4_ + local_1420._12_4_,
                                        CONCAT48(auVar58._8_4_ + auVar59._8_4_ + local_1420._8_4_,
                                                 CONCAT44(auVar58._4_4_ +
                                                          auVar59._4_4_ + local_1420._4_4_,
                                                          auVar58._0_4_ +
                                                          auVar59._0_4_ + local_1420._0_4_))));
        auVar64._8_4_ = 0x7fffffff;
        auVar64._0_8_ = 0x7fffffff7fffffff;
        auVar64._12_4_ = 0x7fffffff;
        auVar64._16_4_ = 0x7fffffff;
        auVar64._20_4_ = 0x7fffffff;
        auVar64._24_4_ = 0x7fffffff;
        auVar64._28_4_ = 0x7fffffff;
        local_1400 = ZEXT1632(auVar59);
        auVar60 = vminps_avx(ZEXT1632(local_1420),local_1400);
        auVar60 = vminps_avx(auVar60,ZEXT1632(auVar58));
        local_1200 = vandps_avx(local_13e0,auVar64);
        fVar101 = local_1200._0_4_ * 1.1920929e-07;
        fVar105 = local_1200._4_4_ * 1.1920929e-07;
        auVar28._4_4_ = fVar105;
        auVar28._0_4_ = fVar101;
        fVar106 = local_1200._8_4_ * 1.1920929e-07;
        auVar28._8_4_ = fVar106;
        fVar107 = local_1200._12_4_ * 1.1920929e-07;
        auVar28._12_4_ = fVar107;
        fVar108 = local_1200._16_4_ * 1.1920929e-07;
        auVar28._16_4_ = fVar108;
        fVar109 = local_1200._20_4_ * 1.1920929e-07;
        auVar28._20_4_ = fVar109;
        fVar110 = local_1200._24_4_ * 1.1920929e-07;
        auVar28._24_4_ = fVar110;
        auVar28._28_4_ = 0x34000000;
        auVar98._0_8_ = CONCAT44(fVar105,fVar101) ^ 0x8000000080000000;
        auVar98._8_4_ = -fVar106;
        auVar98._12_4_ = -fVar107;
        auVar98._16_4_ = -fVar108;
        auVar98._20_4_ = -fVar109;
        auVar98._24_4_ = -fVar110;
        auVar98._28_4_ = 0xb4000000;
        auVar60 = vcmpps_avx(auVar60,auVar98,5);
        local_11e0 = ZEXT1632(local_1420);
        auVar66 = vmaxps_avx(ZEXT1632(local_1420),local_1400);
        auVar61 = vmaxps_avx(auVar66,ZEXT1632(auVar58));
        auVar61 = vcmpps_avx(auVar61,auVar28,2);
        auVar61 = vorps_avx(auVar60,auVar61);
        if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar61 >> 0x7f,0) != '\0') ||
              (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar61 >> 0xbf,0) != '\0') ||
            (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar61[0x1f] < '\0') {
          auVar29._4_4_ = fVar97 * local_1120._4_4_;
          auVar29._0_4_ = fVar94 * local_1120._0_4_;
          auVar29._8_4_ = fVar128 * local_1120._8_4_;
          auVar29._12_4_ = fVar132 * local_1120._12_4_;
          auVar29._16_4_ = fVar136 * local_1120._16_4_;
          auVar29._20_4_ = fVar12 * local_1120._20_4_;
          auVar29._24_4_ = fVar15 * local_1120._24_4_;
          auVar29._28_4_ = auVar60._28_4_;
          auVar30._4_4_ = local_1140._4_4_ * fVar96;
          auVar30._0_4_ = local_1140._0_4_ * fVar88;
          auVar30._8_4_ = local_1140._8_4_ * fVar127;
          auVar30._12_4_ = local_1140._12_4_ * fVar131;
          auVar30._16_4_ = local_1140._16_4_ * fVar135;
          auVar30._20_4_ = local_1140._20_4_ * fVar11;
          auVar30._24_4_ = local_1140._24_4_ * fVar14;
          auVar30._28_4_ = 0x34000000;
          auVar58 = vfmsub213ps_fma(local_1140,local_11c0,auVar29);
          auVar31._4_4_ = auVar62._4_4_ * fVar95;
          auVar31._0_4_ = auVar62._0_4_ * fVar93;
          auVar31._8_4_ = auVar62._8_4_ * fVar126;
          auVar31._12_4_ = auVar62._12_4_ * fVar130;
          auVar31._16_4_ = auVar62._16_4_ * fVar133;
          auVar31._20_4_ = auVar62._20_4_ * fVar137;
          auVar31._24_4_ = auVar62._24_4_ * fVar13;
          auVar31._28_4_ = auVar66._28_4_;
          auVar32._4_4_ = auVar73._4_4_ * fVar96;
          auVar32._0_4_ = auVar73._0_4_ * fVar88;
          auVar32._8_4_ = auVar73._8_4_ * fVar127;
          auVar32._12_4_ = auVar73._12_4_ * fVar131;
          auVar32._16_4_ = auVar73._16_4_ * fVar135;
          auVar32._20_4_ = auVar73._20_4_ * fVar11;
          auVar32._24_4_ = auVar73._24_4_ * fVar14;
          auVar32._28_4_ = local_1200._28_4_;
          auVar69 = vfmsub213ps_fma(auVar73,local_11a0,auVar31);
          auVar60 = vandps_avx(auVar29,auVar64);
          auVar66 = vandps_avx(auVar31,auVar64);
          auVar60 = vcmpps_avx(auVar60,auVar66,1);
          local_13c0 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar58),auVar60);
          auVar33._4_4_ = fVar97 * auVar18._4_4_;
          auVar33._0_4_ = fVar94 * auVar18._0_4_;
          auVar33._8_4_ = fVar128 * auVar18._8_4_;
          auVar33._12_4_ = fVar132 * auVar18._12_4_;
          auVar33._16_4_ = fVar136 * auVar18._16_4_;
          auVar33._20_4_ = fVar12 * auVar18._20_4_;
          auVar33._24_4_ = fVar15 * auVar18._24_4_;
          auVar33._28_4_ = auVar60._28_4_;
          auVar58 = vfmsub213ps_fma(auVar18,local_11c0,auVar32);
          auVar34._4_4_ = local_1100._4_4_ * fVar95;
          auVar34._0_4_ = local_1100._0_4_ * fVar93;
          auVar34._8_4_ = local_1100._8_4_ * fVar126;
          auVar34._12_4_ = local_1100._12_4_ * fVar130;
          auVar34._16_4_ = local_1100._16_4_ * fVar133;
          auVar34._20_4_ = local_1100._20_4_ * fVar137;
          auVar34._24_4_ = local_1100._24_4_ * fVar13;
          auVar34._28_4_ = auVar66._28_4_;
          auVar69 = vfmsub213ps_fma(local_1120,auVar17,auVar34);
          auVar60 = vandps_avx(auVar34,auVar64);
          auVar66 = vandps_avx(auVar32,auVar64);
          auVar60 = vcmpps_avx(auVar60,auVar66,1);
          local_13a0 = vblendvps_avx(ZEXT1632(auVar58),ZEXT1632(auVar69),auVar60);
          auVar58 = vfmsub213ps_fma(local_1100,local_11a0,auVar30);
          auVar69 = vfmsub213ps_fma(auVar62,auVar17,auVar33);
          auVar60 = vandps_avx(auVar30,auVar64);
          auVar66 = vandps_avx(auVar33,auVar64);
          auVar66 = vcmpps_avx(auVar60,auVar66,1);
          local_1380 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar58),auVar66);
          auVar58 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
          fVar88 = local_1380._0_4_;
          auVar65._0_4_ = fVar88 * local_1180;
          fVar101 = local_1380._4_4_;
          auVar65._4_4_ = fVar101 * local_1180;
          fVar93 = local_1380._8_4_;
          auVar65._8_4_ = fVar93 * local_1180;
          fVar94 = local_1380._12_4_;
          auVar65._12_4_ = fVar94 * local_1180;
          fVar95 = local_1380._16_4_;
          auVar65._16_4_ = fVar95 * local_1180;
          fVar96 = local_1380._20_4_;
          auVar65._20_4_ = fVar96 * local_1180;
          fVar97 = local_1380._24_4_;
          auVar65._24_4_ = fVar97 * local_1180;
          auVar65._28_4_ = 0;
          auVar69 = vfmadd213ps_fma(auVar122,local_13a0,auVar65);
          auVar69 = vfmadd213ps_fma(local_1160,local_13c0,ZEXT1632(auVar69));
          auVar66 = ZEXT1632(CONCAT412(auVar69._12_4_ + auVar69._12_4_,
                                       CONCAT48(auVar69._8_4_ + auVar69._8_4_,
                                                CONCAT44(auVar69._4_4_ + auVar69._4_4_,
                                                         auVar69._0_4_ + auVar69._0_4_))));
          auVar35._4_4_ = fVar101 * fVar117;
          auVar35._0_4_ = fVar88 * fVar114;
          auVar35._8_4_ = fVar93 * fVar118;
          auVar35._12_4_ = fVar94 * fVar119;
          auVar35._16_4_ = fVar95 * fVar120;
          auVar35._20_4_ = fVar96 * fVar123;
          auVar35._24_4_ = fVar97 * fVar124;
          auVar35._28_4_ = auVar60._28_4_;
          auVar69 = vfmadd213ps_fma(local_15a0,local_13a0,auVar35);
          auVar70 = vfmadd213ps_fma(auVar86,local_13c0,ZEXT1632(auVar69));
          auVar60 = vrcpps_avx(auVar66);
          auVar116._8_4_ = 0x3f800000;
          auVar116._0_8_ = &DAT_3f8000003f800000;
          auVar116._12_4_ = 0x3f800000;
          auVar116._16_4_ = 0x3f800000;
          auVar116._20_4_ = 0x3f800000;
          auVar116._24_4_ = 0x3f800000;
          auVar116._28_4_ = 0x3f800000;
          auVar69 = vfnmadd213ps_fma(auVar60,auVar66,auVar116);
          auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar60,auVar60);
          local_1300._28_4_ = 0x3f800000;
          local_1300._0_28_ =
               ZEXT1628(CONCAT412(auVar69._12_4_ * (auVar70._12_4_ + auVar70._12_4_),
                                  CONCAT48(auVar69._8_4_ * (auVar70._8_4_ + auVar70._8_4_),
                                           CONCAT44(auVar69._4_4_ * (auVar70._4_4_ + auVar70._4_4_),
                                                    auVar69._0_4_ * (auVar70._0_4_ + auVar70._0_4_))
                                          )));
          auVar57 = ZEXT3264(local_1300);
          uVar51 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar86._4_4_ = uVar51;
          auVar86._0_4_ = uVar51;
          auVar86._8_4_ = uVar51;
          auVar86._12_4_ = uVar51;
          auVar86._16_4_ = uVar51;
          auVar86._20_4_ = uVar51;
          auVar86._24_4_ = uVar51;
          auVar86._28_4_ = uVar51;
          uVar51 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar103._4_4_ = uVar51;
          auVar103._0_4_ = uVar51;
          auVar103._8_4_ = uVar51;
          auVar103._12_4_ = uVar51;
          auVar103._16_4_ = uVar51;
          auVar103._20_4_ = uVar51;
          auVar103._24_4_ = uVar51;
          auVar103._28_4_ = uVar51;
          auVar60 = vcmpps_avx(auVar86,local_1300,2);
          auVar61 = vcmpps_avx(local_1300,auVar103,2);
          auVar60 = vandps_avx(auVar61,auVar60);
          auVar69 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
          auVar58 = vpand_avx(auVar69,auVar58);
          auVar60 = vpmovsxwd_avx2(auVar58);
          if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar60 >> 0x7f,0) != '\0') ||
                (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar60 >> 0xbf,0) != '\0') ||
              (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar60[0x1f] < '\0') {
            auVar60 = vcmpps_avx(auVar66,_DAT_02020f00,4);
            auVar69 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
            auVar58 = vpand_avx(auVar58,auVar69);
            local_1560 = vpmovsxwd_avx2(auVar58);
            if ((((((((local_1560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1560 >> 0x7f,0) != '\0') ||
                  (local_1560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1560 >> 0xbf,0) != '\0') ||
                (local_1560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1560[0x1f] < '\0') {
              uStack_1410 = 0;
              uStack_140c = 0;
              uStack_1408 = 0;
              uStack_1404 = 0;
              local_1360 = local_1560;
              local_1280 = local_1220;
              auVar60 = vrcpps_avx(local_13e0);
              auVar112._8_4_ = 0x3f800000;
              auVar112._0_8_ = &DAT_3f8000003f800000;
              auVar112._12_4_ = 0x3f800000;
              auVar112._16_4_ = 0x3f800000;
              auVar112._20_4_ = 0x3f800000;
              auVar112._24_4_ = 0x3f800000;
              auVar112._28_4_ = 0x3f800000;
              auVar69 = vfnmadd213ps_fma(local_13e0,auVar60,auVar112);
              auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar60,auVar60);
              auVar87._8_4_ = 0x219392ef;
              auVar87._0_8_ = 0x219392ef219392ef;
              auVar87._12_4_ = 0x219392ef;
              auVar87._16_4_ = 0x219392ef;
              auVar87._20_4_ = 0x219392ef;
              auVar87._24_4_ = 0x219392ef;
              auVar87._28_4_ = 0x219392ef;
              auVar60 = vcmpps_avx(local_1200,auVar87,5);
              auVar60 = vandps_avx(auVar60,ZEXT1632(auVar69));
              auVar36._4_4_ = local_1420._4_4_ * auVar60._4_4_;
              auVar36._0_4_ = local_1420._0_4_ * auVar60._0_4_;
              auVar36._8_4_ = local_1420._8_4_ * auVar60._8_4_;
              auVar36._12_4_ = local_1420._12_4_ * auVar60._12_4_;
              auVar36._16_4_ = auVar60._16_4_ * 0.0;
              auVar36._20_4_ = auVar60._20_4_ * 0.0;
              auVar36._24_4_ = auVar60._24_4_ * 0.0;
              auVar36._28_4_ = 0;
              auVar61 = vminps_avx(auVar36,auVar112);
              auVar37._4_4_ = auVar59._4_4_ * auVar60._4_4_;
              auVar37._0_4_ = auVar59._0_4_ * auVar60._0_4_;
              auVar37._8_4_ = auVar59._8_4_ * auVar60._8_4_;
              auVar37._12_4_ = auVar59._12_4_ * auVar60._12_4_;
              auVar37._16_4_ = auVar60._16_4_ * 0.0;
              auVar37._20_4_ = auVar60._20_4_ * 0.0;
              auVar37._24_4_ = auVar60._24_4_ * 0.0;
              auVar37._28_4_ = auVar17._28_4_;
              auVar60 = vminps_avx(auVar37,auVar112);
              auVar66 = vsubps_avx(auVar112,auVar61);
              auVar86 = vsubps_avx(auVar112,auVar60);
              local_1320 = vblendvps_avx(auVar60,auVar66,local_1220);
              local_1340 = vblendvps_avx(auVar61,auVar86,local_1220);
              local_12e0[0] = local_13c0._0_4_ * (float)local_1240._0_4_;
              local_12e0[1] = local_13c0._4_4_ * (float)local_1240._4_4_;
              local_12e0[2] = local_13c0._8_4_ * fStack_1238;
              local_12e0[3] = local_13c0._12_4_ * fStack_1234;
              fStack_12d0 = local_13c0._16_4_ * fStack_1230;
              fStack_12cc = local_13c0._20_4_ * fStack_122c;
              fStack_12c8 = local_13c0._24_4_ * fStack_1228;
              uStack_12c4 = local_1340._28_4_;
              local_12c0[0] = (float)local_1240._0_4_ * local_13a0._0_4_;
              local_12c0[1] = (float)local_1240._4_4_ * local_13a0._4_4_;
              local_12c0[2] = fStack_1238 * local_13a0._8_4_;
              local_12c0[3] = fStack_1234 * local_13a0._12_4_;
              fStack_12b0 = fStack_1230 * local_13a0._16_4_;
              fStack_12ac = fStack_122c * local_13a0._20_4_;
              fStack_12a8 = fStack_1228 * local_13a0._24_4_;
              uStack_12a4 = local_1320._28_4_;
              local_12a0[0] = (float)local_1240._0_4_ * fVar88;
              local_12a0[1] = (float)local_1240._4_4_ * fVar101;
              local_12a0[2] = fStack_1238 * fVar93;
              local_12a0[3] = fStack_1234 * fVar94;
              fStack_1290 = fStack_1230 * fVar95;
              fStack_128c = fStack_122c * fVar96;
              fStack_1288 = fStack_1228 * fVar97;
              uStack_1284 = uStack_1224;
              auVar60 = vpmovsxwd_avx2(auVar58);
              auVar75._8_4_ = 0x7f800000;
              auVar75._0_8_ = 0x7f8000007f800000;
              auVar75._12_4_ = 0x7f800000;
              auVar75._16_4_ = 0x7f800000;
              auVar75._20_4_ = 0x7f800000;
              auVar75._24_4_ = 0x7f800000;
              auVar75._28_4_ = 0x7f800000;
              auVar60 = vblendvps_avx(auVar75,local_1300,auVar60);
              auVar61 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar61 = vminps_avx(auVar60,auVar61);
              auVar66 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vminps_avx(auVar61,auVar66);
              auVar66 = vpermpd_avx2(auVar61,0x4e);
              auVar61 = vminps_avx(auVar61,auVar66);
              auVar60 = vcmpps_avx(auVar60,auVar61,0);
              auVar59 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
              auVar59 = vpand_avx(auVar59,auVar58);
              auVar60 = vpmovsxwd_avx2(auVar59);
              if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar60 >> 0x7f,0) == '\0') &&
                    (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar60 >> 0xbf,0) == '\0') &&
                  (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar60[0x1f]) {
                auVar60 = local_1560;
              }
              uVar42 = vmovmskps_avx(auVar60);
              uVar43 = 0;
              for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x80000000) {
                uVar43 = uVar43 + 1;
              }
              do {
                uVar47 = (ulong)uVar43;
                uVar43 = *(uint *)((long)&local_10e0 + uVar47 * 4);
                pGVar9 = (pSVar3->geometries).items[uVar43].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1560 + uVar47 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar51 = *(undefined4 *)(local_1340 + uVar47 * 4);
                    uVar2 = *(undefined4 *)(local_1320 + uVar47 * 4);
                    *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar47 - 8];
                    *(float *)(ray + k * 4 + 0x180) = local_12e0[uVar47];
                    *(float *)(ray + k * 4 + 0x1a0) = local_12c0[uVar47];
                    *(float *)(ray + k * 4 + 0x1c0) = local_12a0[uVar47];
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar51;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1440 + uVar47 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar43;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_1060 = *(undefined4 *)(local_1340 + uVar47 * 4);
                  local_1040 = *(undefined4 *)(local_1320 + uVar47 * 4);
                  local_1020 = *(undefined4 *)((long)&local_1440 + uVar47 * 4);
                  fVar114 = local_12e0[uVar47];
                  fVar117 = local_12c0[uVar47];
                  local_10a0._4_4_ = fVar117;
                  local_10a0._0_4_ = fVar117;
                  local_10a0._8_4_ = fVar117;
                  local_10a0._12_4_ = fVar117;
                  local_10a0._16_4_ = fVar117;
                  local_10a0._20_4_ = fVar117;
                  local_10a0._24_4_ = fVar117;
                  local_10a0._28_4_ = fVar117;
                  fVar117 = local_12a0[uVar47];
                  local_1080._4_4_ = fVar117;
                  local_1080._0_4_ = fVar117;
                  local_1080._8_4_ = fVar117;
                  local_1080._12_4_ = fVar117;
                  local_1080._16_4_ = fVar117;
                  local_1080._20_4_ = fVar117;
                  local_1080._24_4_ = fVar117;
                  local_1080._28_4_ = fVar117;
                  local_1000._4_4_ = uVar43;
                  local_1000._0_4_ = uVar43;
                  local_1000._8_4_ = uVar43;
                  local_1000._12_4_ = uVar43;
                  local_1000._16_4_ = uVar43;
                  local_1000._20_4_ = uVar43;
                  local_1000._24_4_ = uVar43;
                  local_1000._28_4_ = uVar43;
                  local_10c0[0] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[1] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[2] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[3] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[4] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[5] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[6] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[7] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[8] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[9] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[10] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0xb] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[0xc] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[0xd] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[0xe] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0xf] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[0x10] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[0x11] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[0x12] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0x13] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[0x14] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[0x15] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[0x16] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0x17] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[0x18] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[0x19] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  local_10c0[0x1c] = (RTCHitN)SUB41(fVar114,0);
                  local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar114 >> 8);
                  local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar114 >> 0x10);
                  local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar114 >> 0x18);
                  uStack_105c = local_1060;
                  uStack_1058 = local_1060;
                  uStack_1054 = local_1060;
                  uStack_1050 = local_1060;
                  uStack_104c = local_1060;
                  uStack_1048 = local_1060;
                  uStack_1044 = local_1060;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  auVar60 = vpcmpeqd_avx2(local_1000,local_1000);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  uVar51 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar47 - 8];
                  local_1500 = local_1260._0_8_;
                  uStack_14f8 = local_1260._8_8_;
                  uStack_14f0 = local_1260._16_8_;
                  uStack_14e8 = local_1260._24_8_;
                  local_15d0.valid = (int *)&local_1500;
                  local_15d0.geometryUserPtr = pGVar9->userPtr;
                  local_15d0.context = context->user;
                  local_15d0.hit = local_10c0;
                  local_15d0.N = 8;
                  local_15d0.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1520._0_8_ = pauVar50;
                    local_1580 = auVar57._0_32_;
                    local_15a0._0_4_ = uVar51;
                    auVar60 = ZEXT1632(auVar60._0_16_);
                    (*pGVar9->intersectionFilterN)(&local_15d0);
                    auVar57 = ZEXT3264(local_1580);
                    auVar60 = vpcmpeqd_avx2(auVar60,auVar60);
                    pauVar50 = (undefined1 (*) [16])local_1520._0_8_;
                    uVar51 = local_15a0._0_4_;
                  }
                  auVar38._8_8_ = uStack_14f8;
                  auVar38._0_8_ = local_1500;
                  auVar38._16_8_ = uStack_14f0;
                  auVar38._24_8_ = uStack_14e8;
                  auVar66 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
                  auVar61 = auVar60 & ~auVar66;
                  if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar61 >> 0x7f,0) == '\0') &&
                        (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar61 >> 0xbf,0) == '\0') &&
                      (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar61[0x1f]) {
                    auVar66 = auVar66 ^ auVar60;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1580 = auVar57._0_32_;
                      local_15a0._0_4_ = uVar51;
                      auVar60 = ZEXT1632(auVar60._0_16_);
                      (*p_Var10)(&local_15d0);
                      auVar57 = ZEXT3264(local_1580);
                      auVar60 = vpcmpeqd_avx2(auVar60,auVar60);
                      uVar51 = local_15a0._0_4_;
                    }
                    auVar39._8_8_ = uStack_14f8;
                    auVar39._0_8_ = local_1500;
                    auVar39._16_8_ = uStack_14f0;
                    auVar39._24_8_ = uStack_14e8;
                    auVar86 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar39);
                    auVar66 = auVar86 ^ auVar60;
                    auVar61 = auVar60 & ~auVar86;
                    if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar61 >> 0x7f,0) != '\0') ||
                          (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar61 >> 0xbf,0) != '\0') ||
                        (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar61[0x1f] < '\0') {
                      auVar68._0_4_ = auVar86._0_4_ ^ auVar60._0_4_;
                      auVar68._4_4_ = auVar86._4_4_ ^ auVar60._4_4_;
                      auVar68._8_4_ = auVar86._8_4_ ^ auVar60._8_4_;
                      auVar68._12_4_ = auVar86._12_4_ ^ auVar60._12_4_;
                      auVar68._16_4_ = auVar86._16_4_ ^ auVar60._16_4_;
                      auVar68._20_4_ = auVar86._20_4_ ^ auVar60._20_4_;
                      auVar68._24_4_ = auVar86._24_4_ ^ auVar60._24_4_;
                      auVar68._28_4_ = auVar86._28_4_ ^ auVar60._28_4_;
                      auVar60 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])local_15d0.hit);
                      *(undefined1 (*) [32])(local_15d0.ray + 0x180) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])(local_15d0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1a0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])(local_15d0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1c0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])(local_15d0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1e0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar68,*(undefined1 (*) [32])(local_15d0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x200) = auVar60;
                      auVar60 = vpmaskmovd_avx2(auVar68,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x220) = auVar60;
                      auVar60 = vpmaskmovd_avx2(auVar68,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x240) = auVar60;
                      auVar60 = vpmaskmovd_avx2(auVar68,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x260) = auVar60;
                      auVar60 = vpmaskmovd_avx2(auVar68,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x280) = auVar60;
                    }
                  }
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar66 >> 0x7f,0) == '\0') &&
                        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0xbf,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar66[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar51;
                  }
                  *(undefined4 *)(local_1560 + uVar47 * 4) = 0;
                  uVar51 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar56._4_4_ = uVar51;
                  auVar56._0_4_ = uVar51;
                  auVar56._8_4_ = uVar51;
                  auVar56._12_4_ = uVar51;
                  auVar56._16_4_ = uVar51;
                  auVar56._20_4_ = uVar51;
                  auVar56._24_4_ = uVar51;
                  auVar56._28_4_ = uVar51;
                  auVar60 = vcmpps_avx(auVar57._0_32_,auVar56,2);
                  local_1560 = vandps_avx(auVar60,local_1560);
                }
                if ((((((((local_1560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1560 >> 0x7f,0) == '\0') &&
                      (local_1560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1560 >> 0xbf,0) == '\0') &&
                    (local_1560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1560[0x1f]) break;
                auVar67._8_4_ = 0x7f800000;
                auVar67._0_8_ = 0x7f8000007f800000;
                auVar67._12_4_ = 0x7f800000;
                auVar67._16_4_ = 0x7f800000;
                auVar67._20_4_ = 0x7f800000;
                auVar67._24_4_ = 0x7f800000;
                auVar67._28_4_ = 0x7f800000;
                auVar60 = vblendvps_avx(auVar67,auVar57._0_32_,local_1560);
                auVar61 = vshufps_avx(auVar60,auVar60,0xb1);
                auVar61 = vminps_avx(auVar60,auVar61);
                auVar66 = vshufpd_avx(auVar61,auVar61,5);
                auVar61 = vminps_avx(auVar61,auVar66);
                auVar66 = vpermpd_avx2(auVar61,0x4e);
                auVar61 = vminps_avx(auVar61,auVar66);
                auVar61 = vcmpps_avx(auVar60,auVar61,0);
                auVar66 = local_1560 & auVar61;
                auVar60 = local_1560;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar66 >> 0x7f,0) != '\0') ||
                      (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar66 >> 0xbf,0) != '\0') ||
                    (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar66[0x1f] < '\0') {
                  auVar60 = vandps_avx(auVar61,local_1560);
                }
                uVar42 = vmovmskps_avx(auVar60);
                uVar43 = 0;
                for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x80000000) {
                  uVar43 = uVar43 + 1;
                }
              } while( true );
            }
          }
        }
        lVar45 = lVar45 + 1;
      } while (lVar45 != uVar52 - 8);
    }
    uVar51 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar57 = ZEXT1664(CONCAT412(uVar51,CONCAT48(uVar51,CONCAT44(uVar51,uVar51))));
    auVar100 = ZEXT1664(local_1450);
    auVar104 = ZEXT1664(local_1460);
    auVar113 = ZEXT1664(local_1470);
    auVar99 = ZEXT1664(local_1530);
    fVar114 = local_1480;
    fVar117 = fStack_147c;
    fVar118 = fStack_1478;
    fVar119 = fStack_1474;
    fVar120 = local_1490;
    fVar123 = fStack_148c;
    fVar124 = fStack_1488;
    fVar88 = fStack_1484;
    fVar101 = local_14a0;
    fVar93 = fStack_149c;
    fVar94 = fStack_1498;
    fVar95 = fStack_1494;
    fVar96 = local_14b0;
    fVar97 = fStack_14ac;
    fVar126 = fStack_14a8;
    fVar127 = fStack_14a4;
    fVar128 = local_14c0;
    fVar130 = fStack_14bc;
    fVar131 = fStack_14b8;
    fVar132 = fStack_14b4;
    fVar133 = local_14d0;
    fVar135 = fStack_14cc;
    fVar136 = fStack_14c8;
    fVar137 = fStack_14c4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }